

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::asio_rpc_client
          (asio_rpc_client *this,asio_service_impl *_impl,io_service *io_svc,ssl_context *ssl_ctx,
          string *host,string *port,bool ssl_enabled,ptr<logger> *l)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  options *__f;
  element_type *peVar4;
  asio_service_impl *in_RSI;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *in_RDI;
  string *in_R8;
  string *in_R9;
  byte in_stack_00000008;
  context *in_stack_00000010;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  _Placeholder<2> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  type_conflict tVar5;
  io_context *in_stack_ffffffffffffff08;
  verify_mode v;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffff10;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *this_00;
  _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
  *callback;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *psVar6;
  string local_98 [40];
  code *local_70;
  undefined8 local_68;
  byte local_31;
  string *local_30;
  string *local_28;
  asio_service_impl *local_10;
  
  tVar5 = (type_conflict)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_31 = in_stack_00000008 & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_10 = in_RSI;
  rpc_client::rpc_client((rpc_client *)in_RDI);
  std::enable_shared_from_this<nuraft::asio_rpc_client>::enable_shared_from_this
            ((enable_shared_from_this<nuraft::asio_rpc_client> *)0x2534c4);
  (in_RDI->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.service_ =
       (service_type *)&PTR__asio_rpc_client_006d2968;
  *(asio_service_impl **)
   &(in_RDI->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.implementation_.
    protocol_ = local_10;
  psVar6 = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
           &(in_RDI->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.executor_;
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,tVar5);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffef0,
             (io_context *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),0);
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
  stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>
            (psVar6,in_RDI,in_stack_00000010);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
  std::__cxx11::string::string
            ((string *)
             ((long)in_RDI[6].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
                    executor_.
                    super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                    .super_any_executor_base.object_.data + 8),local_28);
  psVar6 = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
           &in_RDI[6].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
            super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
            .super_any_executor_base.target_fns_;
  std::__cxx11::string::string((string *)psVar6,local_30);
  *(byte *)&in_RDI[7].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_
            .super_base_implementation_type.reactor_data_ = local_31 & 1;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)in_stack_fffffffffffffef0,
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
  callback = (_Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
              *)((long)in_RDI[7].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
                       executor_.
                       super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                       .super_any_executor_base.object_.data + 0x10);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer<asio::io_context>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              *)in_stack_fffffffffffffef0,
             (io_context *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),0);
  this_00 = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *)
            &in_RDI[8].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
             super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
             .prop_fns_;
  std::shared_ptr<nuraft::logger>::shared_ptr
            ((shared_ptr<nuraft::logger> *)in_stack_fffffffffffffef0,
             (shared_ptr<nuraft::logger> *)
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  uVar3 = asio_service_impl::assign_client_id
                    (*(asio_service_impl **)
                      &(in_RDI->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                       implementation_.protocol_);
  *(uint64_t *)
   ((long)in_RDI[7].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
          super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
          .super_any_executor_base.object_.data + 8) = uVar3;
  if (((ulong)in_RDI[7].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
              implementation_.super_base_implementation_type.reactor_data_ & 1) != 0) {
    __f = asio_service_impl::get_options(local_10);
    v = (verify_mode)((ulong)__f >> 0x20);
    if ((__f->skip_verification_ & 1U) == 0) {
      asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::
      set_verify_mode(this_00,v);
    }
    else {
      asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>::
      set_verify_mode(this_00,v);
    }
    local_70 = verify_certificate;
    local_68 = 0;
    std::
    bind<bool(nuraft::asio_rpc_client::*)(bool,asio::ssl::verify_context&),nuraft::asio_rpc_client*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&__f->thread_pool_size_,
               (asio_rpc_client **)
               &in_RDI[2].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
                implementation_.protocol_,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               in_stack_fffffffffffffef0);
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
    set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
              (psVar6,callback);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &in_RDI[8].super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
                      executor_.
                      super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                      .prop_fns_);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25381a);
    iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
    if (5 < iVar2) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x25384a);
      msg_if_given_abi_cxx11_((char *)local_98,"asio client created: %p",in_RDI);
      (**(code **)(*(long *)peVar4 + 0x40))
                (peVar4,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"asio_rpc_client",0x39f,local_98);
      std::__cxx11::string::~string(local_98);
    }
  }
  return;
}

Assistant:

asio_rpc_client(asio_service_impl* _impl,
                    asio::io_service& io_svc,
                    ssl_context& ssl_ctx,
                    std::string& host,
                    std::string& port,
                    bool ssl_enabled,
                    ptr<logger> l)
        : impl_(_impl)
        , resolver_(io_svc)
        , socket_(io_svc)
        , ssl_socket_(socket_, ssl_ctx)
        , attempting_conn_(false)
        , host_(host)
        , port_(port)
        , ssl_enabled_(ssl_enabled)
        , ssl_ready_(false)
        , num_send_fails_(0)
        , abandoned_(false)
        , socket_busy_(false)
        , operation_timer_(io_svc)
        , l_(l)
    {
        client_id_ = impl_->assign_client_id();
        if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
            assert(0); // Should not reach here.
#else
            if (_impl->get_options().skip_verification_) {
                ssl_socket_.set_verify_mode(asio::ssl::verify_none);
            } else {
                ssl_socket_.set_verify_mode(asio::ssl::verify_peer);
            }

            ssl_socket_.set_verify_callback
                        ( std::bind( &asio_rpc_client::verify_certificate,
                                     this,
                                     std::placeholders::_1,
                                     std::placeholders::_2 ) );
#endif
        }
        p_tr("asio client created: %p", this);
    }